

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebuggerExceptionManager.cxx
# Opt level: O0

optional<dap::StoppedEvent> * __thiscall
cmDebugger::cmDebuggerExceptionManager::RaiseExceptionIfAny
          (optional<dap::StoppedEvent> *__return_storage_ptr__,cmDebuggerExceptionManager *this,
          MessageType t,string *text)

{
  mapped_type *pmVar1;
  mapped_type *pmVar2;
  cmDebuggerException local_148;
  bool local_101;
  undefined1 local_100 [8];
  StoppedEvent stoppedEvent;
  undefined1 local_40 [8];
  unique_lock<std::mutex> lock;
  string *text_local;
  cmDebuggerExceptionManager *pcStack_18;
  MessageType t_local;
  cmDebuggerExceptionManager *this_local;
  optional<dap::StoppedEvent> *maybeStoppedEvent;
  
  lock._15_1_ = 0;
  text_local._4_4_ = t;
  pcStack_18 = this;
  this_local = (cmDebuggerExceptionManager *)__return_storage_ptr__;
  std::optional<dap::StoppedEvent>::optional(__return_storage_ptr__);
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_40,&this->Mutex);
  pmVar1 = std::
           unordered_map<MessageType,_cmDebugger::cmDebuggerExceptionFilter,_cmDebugger::cmDebuggerExceptionManager::MessageTypeHash,_std::equal_to<MessageType>,_std::allocator<std::pair<const_MessageType,_cmDebugger::cmDebuggerExceptionFilter>_>_>
           ::operator[](&this->ExceptionMap,(key_type *)((long)&text_local + 4));
  pmVar2 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
           ::operator[](&this->RaiseExceptions,&pmVar1->Filter);
  if ((*pmVar2 & 1U) != 0) {
    dap::StoppedEvent::StoppedEvent((StoppedEvent *)local_100);
    local_101 = true;
    dap::optional<dap::boolean>::operator=((optional<dap::boolean> *)local_100,&local_101);
    std::__cxx11::string::operator=((string *)&stoppedEvent.preserveFocusHint,"exception");
    dap::optional<std::__cxx11::string>::operator=
              ((optional<std::__cxx11::string> *)&stoppedEvent,(char (*) [19])"Pause on exception");
    dap::optional<std::__cxx11::string>::operator=
              ((optional<std::__cxx11::string> *)(stoppedEvent.reason.field_2._M_local_buf + 8),text
              );
    pmVar1 = std::
             unordered_map<MessageType,_cmDebugger::cmDebuggerExceptionFilter,_cmDebugger::cmDebuggerExceptionManager::MessageTypeHash,_std::equal_to<MessageType>,_std::allocator<std::pair<const_MessageType,_cmDebugger::cmDebuggerExceptionFilter>_>_>
             ::operator[](&this->ExceptionMap,(key_type *)((long)&text_local + 4));
    std::__cxx11::string::string((string *)&local_148,(string *)pmVar1);
    std::__cxx11::string::string((string *)&local_148.Description,(string *)text);
    std::optional<cmDebugger::cmDebuggerException>::operator=(&this->TheException,&local_148);
    cmDebuggerException::~cmDebuggerException(&local_148);
    std::optional<dap::StoppedEvent>::operator=(__return_storage_ptr__,(StoppedEvent *)local_100);
    dap::StoppedEvent::~StoppedEvent((StoppedEvent *)local_100);
  }
  lock._15_1_ = 1;
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_40);
  if ((lock._15_1_ & 1) == 0) {
    std::optional<dap::StoppedEvent>::~optional(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

cm::optional<dap::StoppedEvent>
cmDebuggerExceptionManager::RaiseExceptionIfAny(MessageType t,
                                                std::string const& text)
{
  cm::optional<dap::StoppedEvent> maybeStoppedEvent;
  std::unique_lock<std::mutex> lock(Mutex);
  if (RaiseExceptions[ExceptionMap[t].Filter]) {
    dap::StoppedEvent stoppedEvent;
    stoppedEvent.allThreadsStopped = true;
    stoppedEvent.reason = "exception";
    stoppedEvent.description = "Pause on exception";
    stoppedEvent.text = text;
    TheException = cmDebuggerException{ ExceptionMap[t].Filter, text };
    maybeStoppedEvent = std::move(stoppedEvent);
  }

  return maybeStoppedEvent;
}